

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyImage::ExceedingBoundariesTest::ExceedingBoundariesTest
          (ExceedingBoundariesTest *this,Context *context)

{
  vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
  *this_00;
  pointer *pptVar1;
  GLenum GVar2;
  iterator iVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  testCase local_80;
  testCase local_58;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"exceeding_boundaries",
             "Test verifies if INVALID_VALUE is generated when CopySubImageData is executed for regions exceeding image boundaries"
            );
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ExceedingBoundariesTest_020cea18;
  lVar4 = 0;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  this_00 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0xffffffff;
  do {
    GVar2 = *(GLenum *)((long)&s_valid_targets + lVar4);
    uVar5 = (uint)(1 < uVar6) * 3 + 1;
    local_58.m_depth = 1;
    local_58.m_dst_y = 0;
    local_58.m_dst_z = 0;
    local_58.m_expected_result = 0;
    local_58.m_src_x = 0;
    local_58.m_src_y = 0;
    local_58.m_src_z = 0;
    local_58.m_dst_x = 0;
    local_80.m_depth = 1;
    local_80.m_dst_y = 0;
    local_80.m_dst_z = 0;
    local_80.m_expected_result = 0;
    local_80.m_src_x = 0;
    local_80.m_src_y = 0;
    local_80.m_src_z = 0;
    local_80.m_dst_x = 0;
    iVar3._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_80.m_tex_target = GVar2;
    local_80.m_height = uVar5;
    local_58.m_tex_target = GVar2;
    local_58.m_height = uVar5;
    if (iVar3._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::ExceedingBoundariesTest::testCase_const&>
                ((vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
                  *)this_00,iVar3,&local_58);
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar3._M_current)->m_dst_z = 0;
      (iVar3._M_current)->m_expected_result = 0;
      (iVar3._M_current)->m_src_y = 0;
      (iVar3._M_current)->m_src_z = 0;
      (iVar3._M_current)->m_dst_x = 0;
      (iVar3._M_current)->m_dst_y = 0;
      (iVar3._M_current)->m_tex_target = GVar2;
      (iVar3._M_current)->m_depth = 1;
      (iVar3._M_current)->m_height = (int)(ulong)uVar5;
      (iVar3._M_current)->m_src_x = (int)((ulong)uVar5 >> 0x20);
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_test_cases).
      super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    if (iVar3._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::ExceedingBoundariesTest::testCase_const&>
                ((vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
                  *)this_00,iVar3,&local_80);
    }
    else {
      (iVar3._M_current)->m_dst_z = local_80.m_dst_z;
      (iVar3._M_current)->m_expected_result = local_80.m_expected_result;
      (iVar3._M_current)->m_src_y = local_80.m_src_y;
      (iVar3._M_current)->m_src_z = local_80.m_src_z;
      (iVar3._M_current)->m_dst_x = local_80.m_dst_x;
      (iVar3._M_current)->m_dst_y = local_80.m_dst_y;
      (iVar3._M_current)->m_tex_target = local_80.m_tex_target;
      (iVar3._M_current)->m_depth = local_80.m_depth;
      (iVar3._M_current)->m_height = local_80.m_height;
      (iVar3._M_current)->m_src_x = local_80.m_src_x;
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    local_58.m_depth = 1;
    local_58.m_src_x = 0;
    local_58.m_src_y = 0xe;
    local_58.m_src_z = 0;
    local_58.m_dst_x = 0;
    local_58.m_dst_y = 0;
    local_58.m_dst_z = 0;
    local_58.m_expected_result = 0x501;
    local_80.m_depth = 1;
    local_80.m_src_x = 0;
    local_80.m_src_y = 0;
    local_80.m_src_z = 0;
    local_80.m_dst_x = 0;
    local_80.m_dst_y = 0xe;
    local_80.m_dst_z = 0;
    local_80.m_expected_result = 0x501;
    iVar3._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_80.m_tex_target = GVar2;
      local_80.m_height = uVar5;
      local_58.m_tex_target = GVar2;
      local_58.m_height = uVar5;
      std::
      vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::ExceedingBoundariesTest::testCase_const&>
                ((vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
                  *)this_00,iVar3,&local_58);
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar3._M_current)->m_dst_z = 0;
      (iVar3._M_current)->m_expected_result = 0x501;
      (iVar3._M_current)->m_src_y = 0xe;
      (iVar3._M_current)->m_src_z = 0;
      (iVar3._M_current)->m_dst_x = 0;
      (iVar3._M_current)->m_dst_y = 0;
      (iVar3._M_current)->m_tex_target = GVar2;
      (iVar3._M_current)->m_depth = 1;
      (iVar3._M_current)->m_height = (int)(ulong)uVar5;
      (iVar3._M_current)->m_src_x = (int)((ulong)uVar5 >> 0x20);
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_test_cases).
      super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
      local_80.m_tex_target = GVar2;
      local_80.m_height = uVar5;
      local_58.m_tex_target = GVar2;
      local_58.m_height = uVar5;
    }
    if (iVar3._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::ExceedingBoundariesTest::testCase_const&>
                ((vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
                  *)this_00,iVar3,&local_80);
    }
    else {
      (iVar3._M_current)->m_dst_z = local_80.m_dst_z;
      (iVar3._M_current)->m_expected_result = local_80.m_expected_result;
      (iVar3._M_current)->m_src_y = local_80.m_src_y;
      (iVar3._M_current)->m_src_z = local_80.m_src_z;
      (iVar3._M_current)->m_dst_x = local_80.m_dst_x;
      (iVar3._M_current)->m_dst_y = local_80.m_dst_y;
      (iVar3._M_current)->m_tex_target = local_80.m_tex_target;
      (iVar3._M_current)->m_depth = local_80.m_depth;
      (iVar3._M_current)->m_height = local_80.m_height;
      (iVar3._M_current)->m_src_x = local_80.m_src_x;
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    local_58.m_depth = 1;
    local_58.m_src_x = 0xe;
    local_58.m_src_y = 0;
    local_58.m_src_z = 0;
    local_58.m_dst_x = 0;
    local_58.m_dst_y = 0;
    local_58.m_dst_z = 0;
    local_58.m_expected_result = 0x501;
    local_80.m_depth = 1;
    local_80.m_src_x = 0;
    local_80.m_src_y = 0;
    local_80.m_src_z = 0;
    local_80.m_dst_x = 0xe;
    local_80.m_dst_y = 0;
    local_80.m_dst_z = 0;
    local_80.m_expected_result = 0x501;
    iVar3._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_80.m_tex_target = GVar2;
      local_80.m_height = uVar5;
      local_58.m_tex_target = GVar2;
      local_58.m_height = uVar5;
      std::
      vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::ExceedingBoundariesTest::testCase_const&>
                ((vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
                  *)this_00,iVar3,&local_58);
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar3._M_current)->m_dst_z = 0;
      (iVar3._M_current)->m_expected_result = 0x501;
      (iVar3._M_current)->m_src_y = 0;
      (iVar3._M_current)->m_src_z = 0;
      (iVar3._M_current)->m_dst_x = 0;
      (iVar3._M_current)->m_dst_y = 0;
      (iVar3._M_current)->m_tex_target = GVar2;
      (iVar3._M_current)->m_depth = 1;
      (iVar3._M_current)->m_height = uVar5;
      (iVar3._M_current)->m_src_x = 0xe;
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_test_cases).
      super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
      local_80.m_tex_target = GVar2;
      local_80.m_height = uVar5;
      local_58.m_tex_target = GVar2;
      local_58.m_height = uVar5;
    }
    if (iVar3._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::ExceedingBoundariesTest::testCase_const&>
                ((vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
                  *)this_00,iVar3,&local_80);
    }
    else {
      (iVar3._M_current)->m_dst_z = local_80.m_dst_z;
      (iVar3._M_current)->m_expected_result = local_80.m_expected_result;
      (iVar3._M_current)->m_src_y = local_80.m_src_y;
      (iVar3._M_current)->m_src_z = local_80.m_src_z;
      (iVar3._M_current)->m_dst_x = local_80.m_dst_x;
      (iVar3._M_current)->m_dst_y = local_80.m_dst_y;
      (iVar3._M_current)->m_tex_target = local_80.m_tex_target;
      (iVar3._M_current)->m_depth = local_80.m_depth;
      (iVar3._M_current)->m_height = local_80.m_height;
      (iVar3._M_current)->m_src_x = local_80.m_src_x;
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    local_58.m_depth = 1;
    local_58.m_src_x = 0xe;
    local_58.m_src_y = 0xe;
    local_58.m_src_z = 0;
    local_58.m_dst_x = 0;
    local_58.m_dst_y = 0;
    local_58.m_dst_z = 0;
    local_58.m_expected_result = 0x501;
    local_80.m_depth = 1;
    local_80.m_src_x = 0;
    local_80.m_src_y = 0;
    local_80.m_src_z = 0;
    local_80.m_dst_x = 0xe;
    local_80.m_dst_y = 0xe;
    local_80.m_dst_z = 0;
    local_80.m_expected_result = 0x501;
    iVar3._M_current =
         (this->m_test_cases).
         super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_80.m_tex_target = GVar2;
      local_80.m_height = uVar5;
      local_58.m_tex_target = GVar2;
      local_58.m_height = uVar5;
      std::
      vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::ExceedingBoundariesTest::testCase_const&>
                ((vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
                  *)this_00,iVar3,&local_58);
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (iVar3._M_current)->m_dst_z = 0;
      (iVar3._M_current)->m_expected_result = 0x501;
      (iVar3._M_current)->m_src_y = 0xe;
      (iVar3._M_current)->m_src_z = 0;
      (iVar3._M_current)->m_dst_x = 0;
      (iVar3._M_current)->m_dst_y = 0;
      (iVar3._M_current)->m_tex_target = GVar2;
      (iVar3._M_current)->m_depth = 1;
      (iVar3._M_current)->m_height = uVar5;
      (iVar3._M_current)->m_src_x = 0xe;
      iVar3._M_current =
           (this->m_test_cases).
           super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_test_cases).
      super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current;
      local_80.m_tex_target = GVar2;
      local_80.m_height = uVar5;
      local_58.m_tex_target = GVar2;
      local_58.m_height = uVar5;
    }
    if (iVar3._M_current ==
        (this->m_test_cases).
        super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
      ::_M_realloc_insert<gl4cts::CopyImage::ExceedingBoundariesTest::testCase_const&>
                ((vector<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>>
                  *)this_00,iVar3,&local_80);
    }
    else {
      (iVar3._M_current)->m_dst_z = local_80.m_dst_z;
      (iVar3._M_current)->m_expected_result = local_80.m_expected_result;
      (iVar3._M_current)->m_src_y = local_80.m_src_y;
      (iVar3._M_current)->m_src_z = local_80.m_src_z;
      (iVar3._M_current)->m_dst_x = local_80.m_dst_x;
      (iVar3._M_current)->m_dst_y = local_80.m_dst_y;
      (iVar3._M_current)->m_tex_target = local_80.m_tex_target;
      (iVar3._M_current)->m_depth = local_80.m_depth;
      (iVar3._M_current)->m_height = local_80.m_height;
      (iVar3._M_current)->m_src_x = local_80.m_src_x;
      pptVar1 = &(this->m_test_cases).
                 super__Vector_base<gl4cts::CopyImage::ExceedingBoundariesTest::testCase,_std::allocator<gl4cts::CopyImage::ExceedingBoundariesTest::testCase>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pptVar1 = *pptVar1 + 1;
    }
    uVar6 = uVar6 + 1;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x2c);
  return;
}

Assistant:

ExceedingBoundariesTest::ExceedingBoundariesTest(deqp::Context& context)
	: TestCase(context, "exceeding_boundaries", "Test verifies if INVALID_VALUE is generated when CopySubImageData is "
												"executed for regions exceeding image boundaries")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* 16x16x6 are values used by prepareTex16x16x6 */
	static const GLuint invalid_x = 16 - (m_region_width / 2);
	static const GLuint invalid_y = 16 - (m_region_height / 2);
	static const GLuint invalid_z = 6 - (m_region_depth / 2);

	static const GLuint x_vals[] = { 0, invalid_x };
	static const GLuint y_vals[] = { 0, invalid_y };
	static const GLuint z_vals[] = { 0, invalid_z };

	static const GLuint n_x_vals = sizeof(x_vals) / sizeof(x_vals[0]);
	static const GLuint n_y_vals = sizeof(y_vals) / sizeof(y_vals[0]);
	static const GLuint n_z_vals = sizeof(z_vals) / sizeof(z_vals[0]);

	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];
		GLuint		 height		= m_region_height;

		if (GL_TEXTURE_BUFFER == tex_target)
		{
			continue;
		}

		if ((GL_TEXTURE_1D == tex_target) || (GL_TEXTURE_1D_ARRAY == tex_target))
		{
			height = 1;
		}

		for (GLuint x = 0; x < n_x_vals; ++x)
		{
			for (GLuint y = 0; y < n_y_vals; ++y)
			{
				for (GLuint z = 0; z < n_z_vals; ++z)
				{
					const GLuint x_val = x_vals[x];
					const GLuint y_val = y_vals[y];
					const GLuint z_val = z_vals[z];
					const GLenum res = ((0 == x_val) && (0 == y_val) && (0 == z_val)) ? GL_NO_ERROR : GL_INVALID_VALUE;
					GLuint		 depth = 1;

					if (0 != z_val)
					{
						if ((GL_TEXTURE_2D_ARRAY != tex_target) || (GL_TEXTURE_2D_MULTISAMPLE_ARRAY != tex_target) ||
							(GL_TEXTURE_3D != tex_target) || (GL_TEXTURE_CUBE_MAP_ARRAY != tex_target))
						{
							/* Skip z != 0 for 2d textures */
							continue;
						}
						else
						{
							/* Set depth so as to exceed boundary */
							depth = m_region_depth;
						}
					}

					testCase src_test_case = { tex_target, depth, height, x_val, y_val, z_val, 0, 0, 0, res };

					testCase dst_test_case = { tex_target, depth, height, 0, 0, 0, x_val, y_val, z_val, res };

					m_test_cases.push_back(src_test_case);
					m_test_cases.push_back(dst_test_case);
				}
			}
		}
	}
}